

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O1

void luaF_close(lua_State *L,StkId level)

{
  UpVal *uv;
  TValue *pTVar1;
  undefined8 uVar2;
  TValue *io1;
  
  uv = L->openupval;
  while ((uv != (UpVal *)0x0 && (pTVar1 = uv->v, level <= pTVar1))) {
    L->openupval = (uv->u).open.next;
    if (uv->refcount == 0) {
      luaM_realloc_(L,uv,0x20,0);
    }
    else {
      uVar2 = *(undefined8 *)&pTVar1->tt_;
      (uv->u).open.next = (UpVal *)pTVar1->value_;
      *(undefined8 *)((long)&uv->u + 8) = uVar2;
      uv->v = (TValue *)&uv->u;
      if ((undefined1  [16])((undefined1  [16])uv->u & (undefined1  [16])0x40) !=
          (undefined1  [16])0x0) {
        luaC_upvalbarrier_(L,uv);
      }
    }
    uv = L->openupval;
  }
  return;
}

Assistant:

int luaF_close (lua_State *L, StkId level, int status) {
  UpVal *uv;
  while ((uv = L->openupval) != NULL && uplevel(uv) >= level) {
    TValue *slot = &uv->u.value;  /* new position for value */
    lua_assert(uplevel(uv) < L->top);
    if (uv->tbc && status != NOCLOSINGMETH) {
      /* must run closing method, which may change the stack */
      ptrdiff_t levelrel = savestack(L, level);
      status = callclosemth(L, uplevel(uv), status);
      level = restorestack(L, levelrel);
    }
    luaF_unlinkupval(uv);
    setobj(L, slot, uv->v);  /* move value to upvalue slot */
    uv->v = slot;  /* now current value lives here */
    if (!iswhite(uv))
      gray2black(uv);  /* closed upvalues cannot be gray */
    luaC_barrier(L, uv, slot);
  }
  return status;
}